

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O1

void __thiscall eglu::anon_unknown_1::RenderContext::postIterate(RenderContext *this)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ResourceError *pRVar4;
  int newWidth;
  int newHeight;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  RenderTarget local_88;
  string local_60;
  code *local_40;
  int local_38;
  long *plVar3;
  
  iVar2 = (*this->m_display->_vptr_NativeDisplay[2])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (this->m_window == (NativeWindow *)0x0) {
    (*(this->m_glFunctions).flush)();
    return;
  }
  iVar2 = (**(code **)(*plVar3 + 0x188))(plVar3,this->m_eglDisplay,this->m_eglSurface);
  local_38 = (**(code **)(*plVar3 + 0xf8))(plVar3);
  if (((iVar2 == 0) && (local_38 != 0x300b)) && (local_38 != 0x300d)) {
    pRVar4 = (ResourceError *)__cxa_allocate_exception(0x38);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"eglSwapBuffers() failed: ","");
    local_40 = getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   &local_a8,&local_60);
    tcu::ResourceError::ResourceError(pRVar4,(string *)&local_88);
    __cxa_throw(pRVar4,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  (*this->m_window->_vptr_NativeWindow[4])();
  if (iVar2 != 0) {
    local_a8._M_dataplus._M_p = (pointer)((ulong)local_a8._M_dataplus._M_p._4_4_ << 0x20);
    local_60._M_dataplus._M_p._0_4_ = 0;
    (**(code **)(*plVar3 + 0x158))(plVar3,this->m_eglDisplay,this->m_eglSurface,0x3057,&local_a8);
    (**(code **)(*plVar3 + 0x158))(plVar3,this->m_eglDisplay,this->m_eglSurface,0x3056,&local_60);
    err = (**(code **)(*plVar3 + 0xf8))(plVar3);
    checkError(err,"Failed to query window size",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x232);
    uVar1 = (this->m_glRenderTarget).m_width;
    if (((uint)local_a8._M_dataplus._M_p != uVar1) ||
       ((uint)local_60._M_dataplus._M_p != (this->m_glRenderTarget).m_height)) {
      tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
                 (ulong)uVar1,(ulong)(uint)(this->m_glRenderTarget).m_height,
                 (ulong)local_a8._M_dataplus._M_p & 0xffffffff,
                 (ulong)(uint)local_60._M_dataplus._M_p);
      tcu::RenderTarget::RenderTarget
                (&local_88,(uint)local_a8._M_dataplus._M_p,(uint)local_60._M_dataplus._M_p,
                 &(this->m_glRenderTarget).m_pixelFormat,(this->m_glRenderTarget).m_depthBits,
                 (this->m_glRenderTarget).m_stencilBits,(this->m_glRenderTarget).m_numSamples);
      (this->m_glRenderTarget).m_numSamples = local_88.m_numSamples;
      (this->m_glRenderTarget).m_pixelFormat.blueBits = local_88.m_pixelFormat.blueBits;
      (this->m_glRenderTarget).m_pixelFormat.alphaBits = local_88.m_pixelFormat.alphaBits;
      (this->m_glRenderTarget).m_depthBits = local_88.m_depthBits;
      (this->m_glRenderTarget).m_stencilBits = local_88.m_stencilBits;
      (this->m_glRenderTarget).m_width = local_88.m_width;
      (this->m_glRenderTarget).m_height = local_88.m_height;
      (this->m_glRenderTarget).m_pixelFormat.redBits = local_88.m_pixelFormat.redBits;
      (this->m_glRenderTarget).m_pixelFormat.greenBits = local_88.m_pixelFormat.greenBits;
    }
    return;
  }
  pRVar4 = (ResourceError *)__cxa_allocate_exception(0x38);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"eglSwapBuffers() failed: ","");
  local_40 = getErrorName;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                 &local_a8,&local_60);
  tcu::ResourceError::ResourceError(pRVar4,(string *)&local_88);
  __cxa_throw(pRVar4,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderContext::postIterate (void)
{
	const Library& egl = m_display->getLibrary();

	if (m_window)
	{
		EGLBoolean	swapOk		= egl.swapBuffers(m_eglDisplay, m_eglSurface);
		EGLint		error		= egl.getError();
		const bool	badWindow	= error == EGL_BAD_SURFACE || error == EGL_BAD_NATIVE_WINDOW;

		if (!swapOk && !badWindow)
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());

		try
		{
			m_window->processEvents();
		}
		catch (const WindowDestroyedError&)
		{
			tcu::print("Warning: Window destroyed, recreating...\n");

			EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
			EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));
			m_eglSurface = EGL_NO_SURFACE;

			delete m_window;
			m_window = DE_NULL;

			try
			{
				WindowSurfacePair windowSurface = createWindow(m_display, m_nativeWindowFactory, m_eglDisplay, m_eglConfig, m_renderConfig);
				m_window		= windowSurface.first;
				m_eglSurface	= windowSurface.second;

				EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

				swapOk	= EGL_TRUE;
				error	= EGL_SUCCESS;
			}
			catch (const std::exception& e)
			{
				if (m_eglSurface)
				{
					egl.makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
					egl.destroySurface(m_eglDisplay, m_eglSurface);
					m_eglSurface = EGL_NO_SURFACE;
				}

				delete m_window;
				m_window = DE_NULL;

				throw tcu::ResourceError(string("Failed to re-create window: ") + e.what());
			}
		}

		if (!swapOk)
		{
			DE_ASSERT(badWindow);
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());
		}

		// Refresh dimensions
		{
			int	newWidth	= 0;
			int	newHeight	= 0;

			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_WIDTH,		&newWidth);
			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_HEIGHT,	&newHeight);
			EGLU_CHECK_MSG(egl, "Failed to query window size");

			if (newWidth	!= m_glRenderTarget.getWidth() ||
				newHeight	!= m_glRenderTarget.getHeight())
			{
				tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
						   m_glRenderTarget.getWidth(), m_glRenderTarget.getHeight(), newWidth, newHeight);

				m_glRenderTarget = tcu::RenderTarget(newWidth, newHeight,
													 m_glRenderTarget.getPixelFormat(),
													 m_glRenderTarget.getDepthBits(),
													 m_glRenderTarget.getStencilBits(),
													 m_glRenderTarget.getNumSamples());
			}
		}
	}
	else
		m_glFunctions.flush();
}